

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_convert.cpp
# Opt level: O0

void test_char<char>(void)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  ctype *this;
  locale l_3;
  string real_name;
  locale l_2;
  locale l_1;
  string name;
  locale l;
  generator gen;
  string *in_stack_fffffffffffffb30;
  generator *in_stack_fffffffffffffb38;
  allocator *paVar5;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  string *in_stack_fffffffffffffb58;
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [32];
  locale local_360 [8];
  locale local_358 [15];
  allocator local_349;
  string local_348 [32];
  string local_328 [32];
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [24];
  string *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  locale *in_stack_fffffffffffffda0;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  locale local_1f8 [15];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  locale local_130 [15];
  allocator local_121;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [32];
  locale local_20 [24];
  generator local_8 [8];
  
  booster::locale::generator::generator(local_8);
  poVar2 = std::operator<<((ostream *)&std::cout,"- Testing at least C");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"en_US.UTF-8",&local_41);
  booster::locale::generator::operator()(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Hello World i",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"hello world i",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"HELLO WORLD I",&local_b9);
  test_one<char>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::string(local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"en_US.UTF-8",&local_121);
  get_std_name(in_stack_fffffffffffffb58,
               (string *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  std::__cxx11::string::operator=(local_e0,local_100);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"- Testing ");
    poVar2 = std::operator<<(poVar2,local_e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    booster::locale::generator::operator()(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,anon_var_dwarf_2764,&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,anon_var_dwarf_276e,&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,anon_var_dwarf_2778,&local_1a1);
    test_one<char>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd88);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::locale::~locale(local_130);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"- en_US.UTF-8 is not supported, skipping");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"en_US.ISO8859-1",&local_1e9);
  get_std_name(in_stack_fffffffffffffb58,
               (string *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  std::__cxx11::string::operator=(local_e0,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar2 = std::operator<<(poVar2,local_e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    booster::locale::generator::operator()(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"Hello World",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"hello world",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffd98,"HELLO WORLD",
               (allocator *)&stack0xfffffffffffffd97);
    test_one<char>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd88);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd97);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,anon_var_dwarf_2764,&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,anon_var_dwarf_276e,&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e0,anon_var_dwarf_2778,&local_2e1);
    test_one<char>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd88);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    std::locale::~locale(local_1f8);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"- en_US.ISO8859-1 is not supported, skipping");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string(local_308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"tr_TR.UTF-8",&local_349);
  get_std_name(in_stack_fffffffffffffb58,
               (string *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  std::__cxx11::string::operator=(local_e0,local_328);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar2 = std::operator<<(poVar2,local_e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::locale::locale(local_358,pcVar4);
    this = std::use_facet<std::ctype<wchar_t>>(local_358);
    iVar1 = std::__ctype_abstract_base<wchar_t>::toupper
                      ((__ctype_abstract_base<wchar_t> *)this,0x69);
    std::locale::~locale(local_358);
    if (iVar1 == 0x49) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Standard library does not support this locale\'s case conversion correctly"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      booster::locale::generator::operator()(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"i",&local_381);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a8,"i",&local_3a9);
      paVar5 = &local_3d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d0,anon_var_dwarf_2800,paVar5);
      test_one<char>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      std::__cxx11::string::~string(local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
      std::locale::~locale(local_360);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"- tr_TR.UTF-8 is not supported, skipping");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_e0);
  std::locale::~locale(local_20);
  booster::locale::generator::~generator(local_8);
  return;
}

Assistant:

void test_char()
{
    booster::locale::generator gen;

    std::cout << "- Testing at least C" << std::endl;

    std::locale l = gen("en_US.UTF-8");

    test_one<CharType>(l,"Hello World i","hello world i","HELLO WORLD I");

    std::string name;

    name = get_std_name("en_US.UTF-8");
    if(!name.empty()) {
        std::cout << "- Testing " << name << std::endl;
        std::locale l=gen(name);
        test_one<CharType>(l,"Façade","façade","FAÇADE");
    }
    else {
        std::cout << "- en_US.UTF-8 is not supported, skipping" << std::endl;
    }

    name = get_std_name("en_US.ISO8859-1");
    if(!name.empty()) {
        std::cout << "Testing " << name << std::endl;
        std::locale l=gen(name);
        test_one<CharType>(l,"Hello World","hello world","HELLO WORLD");
        test_one<CharType>(l,"Façade","façade","FAÇADE");
    }
    else {
        std::cout << "- en_US.ISO8859-1 is not supported, skipping" << std::endl;
    }
    std::string real_name;
    name = get_std_name("tr_TR.UTF-8",&real_name);
    if(!name.empty()) {
        std::cout << "Testing " << name << std::endl;
        if(std::use_facet<std::ctype<wchar_t> >(std::locale(real_name.c_str())).toupper(L'i')!=L'I') {
            std::locale l=gen(name);
            test_one<CharType>(l,"i","i","İ");
        }
        else {
            std::cout << "Standard library does not support this locale's case conversion correctly" << std::endl;
        }
    }
    else 
    {
        std::cout << "- tr_TR.UTF-8 is not supported, skipping" << std::endl;
    }
}